

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

void __thiscall
Clique::computeIntervalIntersection(Clique *this,uint *interval_start,uint *interval_end)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  uint *puVar5;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  uint *in_RSI;
  long in_RDI;
  AlignmentRecord *ap;
  size_t i;
  int n;
  uint *in_stack_ffffffffffffffa8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  uint local_38;
  uint local_34;
  AlignmentRecord *local_30;
  ulong local_28;
  int local_1c;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  uint *local_10;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_28 = 0; uVar1 = local_28,
      sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                          (in_RDI + 0x20)), uVar1 < sVar4; local_28 = local_28 + 1) {
    bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                      (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    if (bVar2) {
      local_30 = (AlignmentRecord *)
                 (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))
                           (*(long **)(in_RDI + 0x28),local_28);
      if (local_1c == 0) {
        local_1c = local_1c + 1;
        uVar3 = AlignmentRecord::getIntervalStart(local_30);
        *local_10 = uVar3;
        uVar3 = AlignmentRecord::getIntervalEnd(local_30);
        *(uint *)&(local_18->m_bits).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = uVar3;
      }
      else {
        in_stack_ffffffffffffffa8 = local_10;
        local_1c = local_1c + 1;
        local_34 = AlignmentRecord::getIntervalStart(local_30);
        puVar5 = std::max<unsigned_int>(in_stack_ffffffffffffffa8,&local_34);
        *local_10 = *puVar5;
        in_stack_ffffffffffffffb0 = local_18;
        local_38 = AlignmentRecord::getIntervalEnd(local_30);
        puVar5 = std::min<unsigned_int>((uint *)in_stack_ffffffffffffffb0,&local_38);
        *(uint *)&(local_18->m_bits).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start = *puVar5;
      }
    }
  }
  return;
}

Assistant:

void Clique::computeIntervalIntersection(unsigned int* interval_start, unsigned int* interval_end) {
	int n = 0;
	// for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
	for (size_t i=0; i<alignment_set->size(); ++i) {
		if (!alignment_set->test(i)) continue;
		const AlignmentRecord& ap = parent.getAlignmentByIndex(i);
		if (n++==0) {
			*interval_start = ap.getIntervalStart();
			*interval_end = ap.getIntervalEnd();
		} else {
			*interval_start = max(*interval_start,ap.getIntervalStart());
			*interval_end = min(*interval_end,ap.getIntervalEnd());
		}
	}
}